

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O0

shared_ptr<mocker::detail::ReassociationImpl::Node> __thiscall
mocker::detail::ReassociationImpl::buildTrees
          (ReassociationImpl *this,shared_ptr<mocker::ir::Addr> *node,bool firstNode)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  FunctionModule *func;
  bool bVar1;
  OpType OVar2;
  OpType OVar3;
  element_type *peVar4;
  string *psVar5;
  Def *pDVar6;
  size_t sVar7;
  size_t sVar8;
  shared_ptr<mocker::ir::IRInst> *psVar9;
  element_type *peVar10;
  element_type *peVar11;
  element_type *peVar12;
  element_type *this_01;
  shared_ptr<mocker::ir::Addr> *psVar13;
  byte in_CL;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  shared_ptr<mocker::detail::ReassociationImpl::Node> sVar15;
  undefined1 local_14c [4];
  undefined1 local_148 [23];
  undefined1 local_131;
  undefined1 local_130 [8];
  shared_ptr<mocker::ir::Assign> assign;
  undefined1 local_10c [12];
  undefined1 local_100 [8];
  shared_ptr<mocker::ir::ArithUnaryInst> unary;
  undefined1 local_e0 [27];
  undefined1 local_c5;
  undefined1 local_c4 [4];
  undefined1 local_c0 [8];
  shared_ptr<mocker::ir::ArithBinaryInst> binary;
  shared_ptr<mocker::ir::IRInst> inst;
  undefined1 local_98 [8];
  Def def;
  undefined1 local_78 [8];
  shared_ptr<mocker::ir::Reg> reg;
  undefined1 local_60 [8];
  shared_ptr<mocker::ir::Reg> gReg;
  undefined1 local_3c [4];
  undefined1 local_38 [8];
  shared_ptr<mocker::ir::IntLiteral> lit;
  bool firstNode_local;
  shared_ptr<mocker::ir::Addr> *node_local;
  ReassociationImpl *this_local;
  shared_ptr<mocker::detail::ReassociationImpl::Node> *res;
  
  psVar13 = (shared_ptr<mocker::ir::Addr> *)CONCAT71(in_register_00000011,firstNode);
  lit.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
       = in_CL & 1;
  ir::dyc<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>((ir *)local_38,psVar13);
  gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
       std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_)
  {
    local_3c = (undefined1  [4])0x1;
    std::
    make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::IntLiteral>&>
              ((Type *)this,(shared_ptr<mocker::ir::IntLiteral> *)local_3c);
  }
  gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._1_3_ = 0;
  std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr
            ((shared_ptr<mocker::ir::IntLiteral> *)local_38);
  _Var14._M_pi = extraout_RDX;
  if ((uint)gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != 0) goto LAB_0022ae4c;
  ir::dycGlobalReg((ir *)local_60,psVar13);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
  if (bVar1) {
    reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 2;
    std::
    make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
              ((Type *)this,
               (shared_ptr<mocker::ir::Reg> *)
               ((long)&reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 4));
  }
  gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._1_3_ = 0;
  gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
       bVar1;
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_60);
  _Var14._M_pi = extraout_RDX_00;
  if ((uint)gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != 0) goto LAB_0022ae4c;
  ir::dycLocalReg((ir *)local_78,psVar13);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
  if (!bVar1) {
    __assert_fail("reg",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/reassociation.cpp"
                  ,0x41,
                  "std::shared_ptr<detail::ReassociationImpl::Node> mocker::detail::ReassociationImpl::buildTrees(const std::shared_ptr<ir::Addr> &, bool)"
                 );
  }
  func = (FunctionModule *)
         (node->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  peVar4 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_78);
  psVar5 = ir::Reg::getIdentifier_abi_cxx11_(peVar4);
  bVar1 = isParameter(func,psVar5);
  if (bVar1) {
LAB_0022a68f:
    def.inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 2;
    std::
    make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
              ((Type *)this,
               (shared_ptr<mocker::ir::Reg> *)
               ((long)&def.inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 4));
    gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1
    ;
  }
  else {
    peVar4 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_78);
    psVar5 = ir::Reg::getIdentifier_abi_cxx11_(peVar4);
    bVar1 = std::operator==(psVar5,".phi_nan");
    if (bVar1) goto LAB_0022a68f;
    if (((lit.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._7_1_ & 1) == 0) &&
       (bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>,std::shared_ptr<mocker::ir::Reg>>
                          ((unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
                            *)(node + 2),(shared_ptr<mocker::ir::Reg> *)local_78), bVar1)) {
      def.inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = 0;
      std::
      make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                ((Type *)this,
                 (shared_ptr<mocker::ir::Reg> *)
                 &def.inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
           1;
    }
    else {
      pDVar6 = UseDefChain::getDef((UseDefChain *)
                                   node[1].
                                   super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_78);
      UseDefChain::Def::Def((Def *)local_98,pDVar6);
      sVar7 = UseDefChain::Def::getBBLabel((Def *)local_98);
      sVar8 = ir::BasicBlock::getLabelID
                        ((BasicBlock *)
                         (node->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      if (sVar7 == sVar8) {
        psVar9 = UseDefChain::Def::getInst((Def *)local_98);
        this_00 = &binary.
                   super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        std::shared_ptr<mocker::ir::IRInst>::shared_ptr
                  ((shared_ptr<mocker::ir::IRInst> *)this_00,psVar9);
        ir::dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>&>
                  ((ir *)local_c0,(shared_ptr<mocker::ir::IRInst> *)this_00);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_c0);
        if (bVar1) {
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_c0);
          OVar2 = ir::ArithBinaryInst::getOp(peVar10);
          if (OVar2 != Add) {
            peVar10 = std::
                      __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_c0);
            OVar2 = ir::ArithBinaryInst::getOp(peVar10);
            if (OVar2 != Sub) {
              local_c4 = (undefined1  [4])0x2;
              std::
              make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                        ((Type *)this,(shared_ptr<mocker::ir::Reg> *)local_c4);
              gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              ._0_4_ = 1;
              goto LAB_0022aa8a;
            }
          }
          local_c5 = 0;
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_c0);
          OVar2 = ir::ArithBinaryInst::getOp(peVar10);
          local_e0._20_4_ = (OVar2 != Add) + 3;
          std::
          make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                    ((Type *)this,(shared_ptr<mocker::ir::Reg> *)(local_e0 + 0x14));
          peVar12 = std::
                    __shared_ptr_access<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_c0);
          psVar13 = ir::ArithBinaryInst::getLhs(peVar10);
          buildTrees((ReassociationImpl *)local_e0,node,SUB81(psVar13,0));
          std::
          vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
          ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                    ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                      *)&peVar12->children,
                     (shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_e0);
          std::shared_ptr<mocker::detail::ReassociationImpl::Node>::~shared_ptr
                    ((shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_e0);
          peVar12 = std::
                    __shared_ptr_access<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_c0);
          psVar13 = ir::ArithBinaryInst::getRhs(peVar10);
          buildTrees((ReassociationImpl *)
                     &unary.
                      super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,node,SUB81(psVar13,0));
          std::
          vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
          ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                    ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                      *)&peVar12->children,
                     (shared_ptr<mocker::detail::ReassociationImpl::Node> *)
                     &unary.
                      super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::shared_ptr<mocker::detail::ReassociationImpl::Node>::~shared_ptr
                    ((shared_ptr<mocker::detail::ReassociationImpl::Node> *)
                     &unary.
                      super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 1;
          local_c5 = 1;
        }
        else {
          gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
        }
LAB_0022aa8a:
        std::shared_ptr<mocker::ir::ArithBinaryInst>::~shared_ptr
                  ((shared_ptr<mocker::ir::ArithBinaryInst> *)local_c0);
        if ((uint)gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi == 0) {
          ir::dyc<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::IRInst>&>
                    ((ir *)local_100,
                     (shared_ptr<mocker::ir::IRInst> *)
                     &binary.
                      super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_100);
          if (bVar1) {
            peVar11 = std::
                      __shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_100);
            OVar3 = ir::ArithUnaryInst::getOp(peVar11);
            if (OVar3 == Neg) {
              local_10c[7] = 0;
              local_10c._0_4_ = 5;
              std::
              make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                        ((Type *)this,(shared_ptr<mocker::ir::Reg> *)local_10c);
              peVar12 = std::
                        __shared_ptr_access<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)this);
              peVar11 = std::
                        __shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_100);
              psVar13 = ir::ArithUnaryInst::getOperand(peVar11);
              buildTrees((ReassociationImpl *)
                         &assign.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,node,SUB81(psVar13,0));
              std::
              vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
              ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                        ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                          *)&peVar12->children,
                         (shared_ptr<mocker::detail::ReassociationImpl::Node> *)
                         &assign.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::shared_ptr<mocker::detail::ReassociationImpl::Node>::~shared_ptr
                        ((shared_ptr<mocker::detail::ReassociationImpl::Node> *)
                         &assign.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              ._0_4_ = 1;
              local_10c[7] = 1;
            }
            else {
              local_10c._8_4_ = 2;
              std::
              make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                        ((Type *)this,(shared_ptr<mocker::ir::Reg> *)(local_10c + 8));
              gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              ._0_4_ = 1;
            }
          }
          else {
            gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _0_4_ = 0;
          }
          std::shared_ptr<mocker::ir::ArithUnaryInst>::~shared_ptr
                    ((shared_ptr<mocker::ir::ArithUnaryInst> *)local_100);
          if ((uint)gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi == 0) {
            ir::dyc<mocker::ir::Assign,std::shared_ptr<mocker::ir::IRInst>&>
                      ((ir *)local_130,
                       (shared_ptr<mocker::ir::IRInst> *)
                       &binary.
                        super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_130);
            if (bVar1) {
              local_131 = 0;
              local_148._16_4_ = 6;
              std::
              make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                        ((Type *)this,(shared_ptr<mocker::ir::Reg> *)(local_148 + 0x10));
              peVar12 = std::
                        __shared_ptr_access<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)this);
              this_01 = std::
                        __shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_130);
              psVar13 = ir::Assign::getOperand(this_01);
              buildTrees((ReassociationImpl *)local_148,node,SUB81(psVar13,0));
              std::
              vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
              ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                        ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                          *)&peVar12->children,
                         (shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_148);
              std::shared_ptr<mocker::detail::ReassociationImpl::Node>::~shared_ptr
                        ((shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_148);
              local_131 = 1;
            }
            gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _1_3_ = 0;
            gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _0_1_ = bVar1;
            std::shared_ptr<mocker::ir::Assign>::~shared_ptr
                      ((shared_ptr<mocker::ir::Assign> *)local_130);
            if ((uint)gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi == 0) {
              local_14c = (undefined1  [4])0x2;
              std::
              make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                        ((Type *)this,(shared_ptr<mocker::ir::Reg> *)local_14c);
              gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              ._0_4_ = 1;
            }
          }
        }
        std::shared_ptr<mocker::ir::IRInst>::~shared_ptr
                  ((shared_ptr<mocker::ir::IRInst> *)
                   &binary.
                    super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = 2;
        std::
        make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                  ((Type *)this,
                   (shared_ptr<mocker::ir::Reg> *)
                   ((long)&inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 4));
        gReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
             = 1;
      }
      UseDefChain::Def::~Def((Def *)local_98);
    }
  }
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_78);
  _Var14._M_pi = extraout_RDX_01;
LAB_0022ae4c:
  sVar15.super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var14._M_pi;
  sVar15.super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<mocker::detail::ReassociationImpl::Node>)
         sVar15.
         super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<detail::ReassociationImpl::Node>
detail::ReassociationImpl::buildTrees(const std::shared_ptr<ir::Addr> &node,
                                      bool firstNode) {
  if (auto lit = ir::dyc<ir::IntLiteral>(node)) {
    return std::make_shared<Node>(Node::Literal, lit);
  }
  if (auto gReg = ir::dycGlobalReg(node)) {
    return std::make_shared<Node>(Node::Leaf, gReg);
  }

  auto reg = ir::dycLocalReg(node);
  assert(reg);
  if (isParameter(func, reg->getIdentifier()) ||
      reg->getIdentifier() == ".phi_nan") {
    return std::make_shared<Node>(Node::Leaf, reg);
  }

  if (!firstNode && isIn(roots, reg)) {
    return std::make_shared<Node>(Node::Root, reg);
  }

  auto def = useDef.getDef(reg);
  if (def.getBBLabel() != bb.getLabelID()) {
    return std::make_shared<Node>(Node::Leaf, reg);
  }

  auto inst = def.getInst();
  if (auto binary = ir::dyc<ir::ArithBinaryInst>(inst)) {
    if (binary->getOp() != ir::ArithBinaryInst::Add &&
        binary->getOp() != ir::ArithBinaryInst::Sub) {
      return std::make_shared<Node>(Node::Leaf, reg);
    }
    auto res = std::make_shared<Node>(
        binary->getOp() == ir::ArithBinaryInst::Add ? Node::Add : Node::Sub,
        reg);
    res->children.emplace_back(buildTrees(binary->getLhs(), false));
    res->children.emplace_back(buildTrees(binary->getRhs(), false));
    return res;
  }

  if (auto unary = ir::dyc<ir::ArithUnaryInst>(inst)) {
    if (unary->getOp() != ir::ArithUnaryInst::Neg)
      return std::make_shared<Node>(Node::Leaf, reg);
    auto res = std::make_shared<Node>(Node::Neg, reg);
    res->children.emplace_back(buildTrees(unary->getOperand(), false));
    return res;
  }

  if (auto assign = ir::dyc<ir::Assign>(inst)) {
    auto res = std::make_shared<Node>(Node::Assign, reg);
    res->children.emplace_back(buildTrees(assign->getOperand(), false));
    return res;
  }

  return std::make_shared<Node>(Node::Leaf, reg);
}